

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall Analyser::analyse_C0_program(Analyser *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  size_t sVar7;
  iterator iVar8;
  string *psVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pTVar12;
  ulong uVar13;
  ulong uVar14;
  optional<Token> next;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tokenValue;
  _Arg local_f8;
  undefined8 local_f0;
  key_type local_e8;
  char local_c8;
  undefined1 local_c0 [32];
  bool local_a0;
  long *local_98;
  long local_90;
  long local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  _Arg local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  do {
    nextToken((optional<Token> *)local_c0,this);
    if ((local_a0 == true) && (local_c0._0_4_ == RESERVED_WORD)) {
      local_e8._M_string_length = 0;
      if ((_func_void__Op_any_ptr__Arg_ptr *)local_c0._8_8_ ==
          (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        local_e8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        local_f8._M_obj = &local_e8;
        (*(code *)local_c0._8_8_)(_Op_clone,(any *)(local_c0 + 8),&local_f8);
      }
      plVar5 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_e8);
      if (plVar5 == (long *)0x0) {
        std::__throw_bad_any_cast();
      }
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_88 = *plVar10;
        uStack_80 = (undefined4)plVar5[3];
        uStack_7c = *(undefined4 *)((long)plVar5 + 0x1c);
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar5;
      }
      local_90 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (*(code *)local_e8._M_dataplus._M_p)(3,&local_e8,0);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar3 == 0) {
        nextToken((optional<Token> *)&local_e8,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)local_c0,
                   (_Optional_payload_base<Token> *)&local_e8);
        if (local_c8 == '\x01') {
          std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)&local_e8)
          ;
        }
        if (local_a0 == false) {
          std::__throw_bad_optional_access();
        }
        local_f0 = 0;
        if ((_func_void__Op_any_ptr__Arg_ptr *)local_c0._8_8_ ==
            (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          local_f8._M_obj = (_Optional_payload_base<Token> *)0x0;
        }
        else {
          local_78._M_obj = &local_f8;
          (*(code *)local_c0._8_8_)(_Op_clone,(any *)(local_c0 + 8),&local_78);
        }
        plVar5 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_f8);
        if (plVar5 == (long *)0x0) {
          std::__throw_bad_any_cast();
        }
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar11) {
          local_e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_e8.field_2._8_8_ = plVar5[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_e8._M_string_length = plVar5[1];
        *plVar5 = (long)paVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((_Optional_payload_base<Token> *)local_f8._M_obj != (_Optional_payload_base<Token> *)0x0
           ) {
          (*(code *)local_f8)(3,&local_f8,0);
        }
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar4 == 0) {
        uVar6 = this->_offset;
        if (uVar6 == 0) goto LAB_00110516;
        pTVar12 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar7 = uVar6 - 1;
        if (uVar6 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5)) {
LAB_001102c6:
          pTVar12 = pTVar12 + sVar7;
          bVar2 = false;
LAB_001104ac:
          this->_currentLine = (int32_t)pTVar12->_lineNumber;
        }
        else {
LAB_0011050a:
          bVar2 = false;
        }
LAB_0011050d:
        this->_offset = sVar7;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar4 == 0) {
          nextToken((optional<Token> *)&local_e8,this);
          std::_Optional_payload_base<Token>::_M_move_assign
                    ((_Optional_payload_base<Token> *)local_c0,
                     (_Optional_payload_base<Token> *)&local_e8);
          if (local_c8 == '\x01') {
            std::_Optional_payload_base<Token>::_M_destroy
                      ((_Optional_payload_base<Token> *)&local_e8);
          }
          if ((local_a0 == true) && (local_c0._0_4_ == IDENTIFIER)) {
            nextToken((optional<Token> *)&local_e8,this);
            std::_Optional_payload_base<Token>::_M_move_assign
                      ((_Optional_payload_base<Token> *)local_c0,
                       (_Optional_payload_base<Token> *)&local_e8);
            if (local_c8 == '\x01') {
              std::_Optional_payload_base<Token>::_M_destroy
                        ((_Optional_payload_base<Token> *)&local_e8);
            }
            if ((local_a0 != false) &&
               ((local_c0._0_4_ == SEMICOLON || (local_c0._0_4_ == ASSIGNMENT_SIGN))))
            goto LAB_0011027c;
            uVar6 = this->_offset;
            if (uVar6 != 0) {
              pTVar12 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar13 = (long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5;
              uVar1 = uVar6 - 1;
              if (uVar6 < uVar13) {
                this->_currentLine = (int32_t)pTVar12[uVar1]._lineNumber;
              }
              this->_offset = uVar1;
              if (uVar1 != 0) {
                uVar14 = uVar6 - 2;
                if (uVar1 < uVar13) {
                  this->_currentLine = (int32_t)pTVar12[uVar14]._lineNumber;
                }
                this->_offset = uVar14;
                if (uVar14 != 0) {
                  sVar7 = uVar6 - 3;
                  goto LAB_00110501;
                }
              }
            }
          }
          else {
            uVar6 = this->_offset;
            if (uVar6 != 0) {
              pTVar12 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar13 = (long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5;
              uVar14 = uVar6 - 1;
              if (uVar6 < uVar13) {
                this->_currentLine = (int32_t)pTVar12[uVar14]._lineNumber;
              }
              this->_offset = uVar14;
              if (uVar14 != 0) {
                sVar7 = uVar6 - 2;
LAB_00110501:
                if (uVar14 < uVar13) goto LAB_001102c6;
                goto LAB_0011050a;
              }
            }
          }
LAB_00110516:
          bVar2 = false;
        }
        else {
LAB_0011027c:
          uVar6 = this->_offset;
          if (iVar3 == 0) {
            if (uVar6 == 0) {
              bVar2 = true;
              goto LAB_00110519;
            }
            pTVar12 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar14 = uVar6 - 1;
            if (uVar6 < (ulong)((long)(this->_tokens).
                                      super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pTVar12 >> 5)) {
              this->_currentLine = (int32_t)pTVar12[uVar14]._lineNumber;
            }
            this->_offset = uVar14;
            uVar6 = uVar14;
          }
          bVar2 = true;
          if (uVar6 != 0) {
            pTVar12 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar13 = (long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)pTVar12 >> 5;
            uVar14 = uVar6 - 1;
            if (uVar6 < uVar13) {
              this->_currentLine = (int32_t)pTVar12[uVar14]._lineNumber;
            }
            this->_offset = uVar14;
            if (uVar14 != 0) {
              uVar1 = uVar6 - 2;
              if (uVar14 < uVar13) {
                this->_currentLine = (int32_t)pTVar12[uVar1]._lineNumber;
              }
              this->_offset = uVar1;
              if (uVar1 != 0) {
                sVar7 = uVar6 - 3;
                bVar2 = true;
                if (uVar1 < uVar13) {
                  pTVar12 = pTVar12 + sVar7;
                  bVar2 = true;
                  goto LAB_001104ac;
                }
                goto LAB_0011050d;
              }
            }
          }
        }
      }
LAB_00110519:
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
    }
    else {
      uVar6 = this->_offset;
      if (uVar6 != 0) {
        pTVar12 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (uVar6 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5)) {
          this->_currentLine = (int32_t)pTVar12[uVar6 - 1]._lineNumber;
        }
        this->_offset = uVar6 - 1;
      }
      bVar2 = false;
    }
    if ((local_a0 & 1U) != 0) {
      std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_c0);
    }
    if ((!bVar2) || (bVar2 = analyse_variable_declaration(this), !bVar2)) {
      do {
        bVar2 = analyse_function_definition(this);
      } while (bVar2);
      nextToken((optional<Token> *)local_c0,this);
      if (local_a0 == true) {
        psVar9 = (string *)__cxa_allocate_exception(0x28);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Redundant tail","");
        iVar3 = this->_currentLine;
        *(string **)psVar9 = psVar9 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar9,local_50,local_50 + local_48);
        *(long *)(psVar9 + 0x20) = (long)iVar3;
        __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"main","");
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(this->_functions)._M_t,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar8._M_node == &(this->_functions)._M_t._M_impl.super__Rb_tree_header
         ) {
        psVar9 = (string *)__cxa_allocate_exception(0x28);
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Must have main()","");
        *(string **)psVar9 = psVar9 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar9,local_70,local_70 + local_68);
        *(undefined8 *)(psVar9 + 0x20) = 0;
        __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
      }
      if (local_a0 == true) {
        std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_c0);
      }
      return;
    }
  } while( true );
}

Assistant:

void Analyser::analyse_C0_program() {
	do {
		//Ԥ����ȷ���Ƿ�Ϊ������������
		bool isConst = false;
		auto next = nextToken();
		if (!next.has_value() || (next.value().GetType() != TokenType::RESERVED_WORD)) {
			unreadToken();
			break;
		}
		auto tokenValue = std::any_cast<std::string>(next.value().GetValue());
		if (tokenValue == "const") {
			isConst = true;
			next = nextToken();
			tokenValue = std::any_cast<std::string>(next.value().GetValue());
		}
		if (tokenValue == "void") {
			unreadToken();
			break;
		}
		if (tokenValue == "int") {
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				unreadToken();
				unreadToken();
				break;
			}
			next = nextToken();
			if (!next.has_value()) {
				unreadToken();
				unreadToken();
				unreadToken();
				break;
			}
			if ((next.value().GetType() != TokenType::ASSIGNMENT_SIGN) && (next.value().GetType() != TokenType::SEMICOLON)) {
				unreadToken();
				unreadToken();
				unreadToken();
				break;
			}
		}
		if (isConst) {
			unreadToken();
		}
		unreadToken();
		unreadToken();
		unreadToken();
	} while (analyse_variable_declaration());
	while (analyse_function_definition()) {}
	auto next = nextToken();
	if (next.has_value()) {
		throw Error("Redundant tail", _currentLine);
	}
	if (_functions.find("main") == _functions.end()) {
		throw Error("Must have main()");
	}
}